

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReduceHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  Var pvVar3;
  Var pvVar4;
  bool bVar5;
  int iVar6;
  ThreadContext *pTVar7;
  Var pvVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  JavascriptLibrary *this;
  RecyclableObject *pRVar10;
  uint *puVar11;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var12;
  Var pvVar13;
  CallInfo local_d8;
  CallInfo local_d0;
  undefined1 local_c8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 end_1;
  Var undefinedValue;
  BOOL hasItem;
  byte local_99;
  uint32 end;
  bool bPresent;
  Var element;
  Var accumulator;
  RecyclableObject *callBackFn;
  uint k;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  RecyclableObject *pRStack_38;
  uint length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local._4_4_ = length;
  pRStack_38 = obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar7 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar7);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar8 = Arguments::operator[](args,1);
    bVar5 = JavascriptConversion::IsCallable(pvVar8);
    if (bVar5) {
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_38), bVar5)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_38);
      }
      callBackFn._0_4_ = 0;
      pvVar8 = Arguments::operator[](args,1);
      accumulator = VarTo<Js::RecyclableObject>(pvVar8);
      element = (Var)0x0;
      _end = (Var)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        if (args_local._4_4_ == 0) {
          if (obj_local != (RecyclableObject *)0x0) {
            JavascriptError::ThrowTypeError
                      ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,
                       L"TypedArray.prototype.reduce");
          }
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,L"Array.prototype.reduce");
        }
        local_99 = 0;
        if (obj_local == (RecyclableObject *)0x0) {
          for (; (uint)callBackFn < args_local._4_4_ && (local_99 & 1) == 0;
              callBackFn._0_4_ = (uint)callBackFn + 1) {
            JsReentLock::unlock((JsReentLock *)local_70);
            undefinedValue._0_4_ = Js::JavascriptOperators::HasItem(pRStack_38,(uint)callBackFn);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            JsReentLock::relock((JsReentLock *)local_70);
            if ((BOOL)undefinedValue != 0) {
              JsReentLock::unlock((JsReentLock *)local_70);
              element = Js::JavascriptOperators::GetItem
                                  (pRStack_38,(uint)callBackFn,(ScriptContext *)jsReentLock._24_8_);
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              JsReentLock::relock((JsReentLock *)local_70);
              local_99 = 1;
            }
          }
        }
        else {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x277b,"(VarIsCorrectType(typedArrayBase))",
                                          "VarIsCorrectType(typedArrayBase)");
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 0;
            }
            Throw::FatalInternalError(-0x7fffbffb);
          }
          undefinedValue._4_4_ = ArrayObject::GetLength((ArrayObject *)obj_local);
          puVar11 = min<unsigned_int>((uint *)((long)&args_local + 4),
                                      (uint *)((long)&undefinedValue + 4));
          hasItem = *puVar11;
          for (; (uint)callBackFn < (uint)hasItem && (local_99 & 1) == 0;
              callBackFn._0_4_ = (uint)callBackFn + 1) {
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)(uint)callBackFn);
            _end = (Var)CONCAT44(extraout_var,iVar6);
            local_99 = 1;
            element = _end;
          }
        }
        if ((local_99 & 1) == 0) {
          if (obj_local != (RecyclableObject *)0x0) {
            JavascriptError::ThrowTypeError
                      ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,
                       L"TypedArray.prototype.reduce");
          }
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,L"Array.prototype.reduce");
        }
      }
      else {
        element = Arguments::operator[](args,2);
      }
      if (element == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x27a2,"(accumulator)","accumulator");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pRVar10 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_70);
        pArr_local = (JavascriptArray *)
                     ReduceObjectHelper<unsigned_int>
                               (pRStack_38,args_local._4_4_,(uint)callBackFn,
                                (RecyclableObject *)accumulator,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar5) {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x27a8,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        autoReentrancyHandler._8_4_ = ArrayObject::GetLength((ArrayObject *)obj_local);
        puVar11 = min<unsigned_int>((uint *)((long)&args_local + 4),
                                    (uint *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        autoReentrancyHandler._12_4_ = *puVar11;
        for (; (uint)callBackFn < (uint)autoReentrancyHandler._12_4_;
            callBackFn._0_4_ = (uint)callBackFn + 1) {
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)(uint)callBackFn);
          _end = (Var)CONCAT44(extraout_var_00,iVar6);
          JsReentLock::unlock((JsReentLock *)local_70);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c8,pTVar7);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar7);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar7);
          pvVar8 = accumulator;
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          CheckIsExecutable((RecyclableObject *)pvVar8,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          pvVar3 = accumulator;
          CallInfo::CallInfo(&local_d0,CallFlags_Value,5);
          pvVar4 = accumulator;
          CallInfo::CallInfo(&local_d8,CallFlags_Value,5);
          pvVar2 = element;
          pvVar8 = _end;
          pvVar13 = JavascriptNumber::ToVar((uint)callBackFn,(ScriptContext *)jsReentLock._24_8_);
          element = (*p_Var12)((RecyclableObject *)pvVar3,(CallInfo)pvVar4,local_d0,0,0,0,0,local_d8
                               ,pRVar10,pvVar2,pvVar8,pvVar13,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
        }
        pArr_local = (JavascriptArray *)element;
      }
      JsReentLock::~JsReentLock((JsReentLock *)local_70);
      return pArr_local;
    }
  }
  if (obj_local != (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.reduce");
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.reduce");
}

Assistant:

Var JavascriptArray::ReduceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduce"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduce"));
            }
        }

        // If we came from Array.prototype.reduce and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        T k = 0;
        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }

            bool bPresent = false;

            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    element = typedArrayBase->DirectGetItem((uint32)k);

                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, k, scriptContext));
                        bPresent = true;
                    }
                }
            }

            if (bPresent == false)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }
        }

        Assert(accumulator);

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem((uint32)k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }